

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

double units::convert<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result)

{
  bool bVar1;
  unit_data uVar2;
  uint uVar3;
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double converted_val_3;
  double converted_val_2;
  unit_data base_result;
  unit_data base_start;
  double genBase;
  double converted_val_1;
  double keyval;
  double converted_val;
  precise_unit *in_stack_fffffffffffffee8;
  precise_unit *in_stack_fffffffffffffef0;
  precise_unit *in_stack_fffffffffffffef8;
  unit *in_stack_ffffffffffffff00;
  unit *in_stack_ffffffffffffff08;
  bool local_e1;
  unit_data *in_stack_ffffffffffffff28;
  precise_unit *in_stack_ffffffffffffff38;
  precise_unit *in_stack_ffffffffffffff40;
  precise_unit *in_stack_ffffffffffffff48;
  precise_unit *in_stack_ffffffffffffff50;
  precise_unit *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  precise_unit *in_stack_ffffffffffffff68;
  unit_data in_stack_ffffffffffffff70;
  unit_data in_stack_ffffffffffffff74;
  double in_stack_ffffffffffffff78;
  unit_data local_38;
  unit_data local_34;
  double local_30;
  unit_data local_24;
  precise_unit *local_20;
  precise_unit *local_18;
  double local_10;
  double local_8;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  bVar1 = precise_unit::operator==(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if (((bVar1) || (bVar1 = is_default(in_stack_fffffffffffffef0), bVar1)) ||
     (bVar1 = is_default(in_stack_fffffffffffffef0), bVar1)) {
    local_8 = local_10;
  }
  else {
    bVar1 = precise_unit::has_e_flag((precise_unit *)0x2c02a1);
    if ((bVar1) || (bVar1 = precise_unit::has_e_flag((precise_unit *)0x2c02b2), bVar1)) {
      in_stack_ffffffffffffff50 = local_18;
      local_24 = precise_unit::base_units(local_20);
      bVar1 = precise_unit::has_same_base
                        (in_stack_fffffffffffffee8,SUB84((ulong)in_stack_fffffffffffffef0 >> 0x20,0)
                        );
      if (bVar1) {
        local_30 = detail::convertFlaggedUnits<units::precise_unit,units::precise_unit>
                             (in_stack_ffffffffffffff78,
                              (precise_unit *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff68,
                              (double)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
        uVar3 = std::isnan(local_30);
        if ((uVar3 & 1) == 0) {
          return local_30;
        }
      }
    }
    bVar1 = precise_unit::is_equation((precise_unit *)0x2c035a);
    if ((bVar1) || (bVar1 = precise_unit::is_equation((precise_unit *)0x2c036b), bVar1)) {
      local_34 = precise_unit::base_units(local_18);
      local_38 = precise_unit::base_units(local_20);
      bVar1 = detail::unit_data::equivalent_non_counting(&local_34,&local_38);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        precise_unit::base_units(local_18);
        precise::equations::convert_equnit_to_value
                  ((double)in_stack_ffffffffffffff58,(unit_data *)in_stack_ffffffffffffff50);
        precise_unit::multiplier(local_18);
        precise_unit::multiplier(local_20);
        precise_unit::base_units(local_20);
        local_8 = precise::equations::convert_value_to_equnit
                            ((double)in_stack_ffffffffffffff68,
                             (unit_data *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      else {
        local_8 = NAN;
      }
    }
    else {
      precise_unit::base_units(local_18);
      precise_unit::base_units(local_20);
      bVar1 = detail::unit_data::operator==
                        ((unit_data *)in_stack_ffffffffffffff00,
                         (unit_data *)in_stack_fffffffffffffef8);
      if (bVar1) {
        dVar4 = precise_unit::multiplier(local_18);
        dVar4 = local_10 * dVar4;
        local_8 = precise_unit::multiplier(local_20);
        local_8 = dVar4 / local_8;
      }
      else {
        bVar1 = precise_unit::is_per_unit((precise_unit *)0x2c054b);
        if ((bVar1) && (bVar1 = precise_unit::is_per_unit((precise_unit *)0x2c0561), bVar1)) {
          unit_cast(in_stack_fffffffffffffef8);
          bVar1 = unit::operator==((unit *)in_stack_fffffffffffffef8,
                                   (unit *)in_stack_fffffffffffffef0);
          local_e1 = true;
          if (!bVar1) {
            unit_cast(in_stack_fffffffffffffef8);
            local_e1 = unit::operator==((unit *)in_stack_fffffffffffffef8,
                                        (unit *)in_stack_fffffffffffffef0);
          }
          if (local_e1 != false) {
            return local_10;
          }
          precise_unit::base_units(local_18);
          precise_unit::base_units(local_20);
          dVar4 = puconversion::knownConversions
                            ((double)in_stack_ffffffffffffff68,
                             (unit_data *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             (unit_data *)in_stack_ffffffffffffff58);
          uVar3 = std::isnan(dVar4);
          if ((uVar3 & 1) == 0) {
            return dVar4;
          }
        }
        else {
          bVar1 = precise_unit::is_per_unit((precise_unit *)0x2c0684);
          if ((bVar1) || (bVar1 = precise_unit::is_per_unit((precise_unit *)0x2c0695), bVar1)) {
            unit_cast(in_stack_fffffffffffffef8);
            unit_cast(in_stack_fffffffffffffef8);
            dVar4 = puconversion::assumedBase(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
            uVar3 = std::isnan(dVar4);
            if ((uVar3 & 1) == 0) {
              dVar4 = convert<units::precise_unit,units::precise_unit>
                                ((double)in_stack_ffffffffffffff68,
                                 (precise_unit *)
                                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff58,(double)in_stack_ffffffffffffff50);
              return dVar4;
            }
            return NAN;
          }
        }
        precise_unit::base_units(local_18);
        precise_unit::base_units(local_20);
        bVar1 = detail::unit_data::has_same_base
                          ((unit_data *)in_stack_ffffffffffffff00,
                           (unit_data *)in_stack_fffffffffffffef8);
        if (bVar1) {
          dVar4 = precise_unit::multiplier(local_18);
          dVar4 = local_10 * dVar4;
          local_8 = precise_unit::multiplier(local_20);
          local_8 = dVar4 / local_8;
        }
        else {
          bVar1 = detail::unit_data::equivalent_non_counting
                            ((unit_data *)&stack0xffffffffffffff74,
                             (unit_data *)&stack0xffffffffffffff70);
          if (bVar1) {
            in_stack_ffffffffffffff68 =
                 (precise_unit *)
                 detail::convertCountingUnits<units::precise_unit,units::precise_unit>
                           ((double)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff38);
            uVar3 = std::isnan((double)in_stack_ffffffffffffff68);
            if ((uVar3 & 1) == 0) {
              return (double)in_stack_ffffffffffffff68;
            }
          }
          uVar2 = detail::unit_data::inv(in_stack_ffffffffffffff28);
          bVar1 = detail::unit_data::has_same_base
                            ((unit_data *)in_stack_ffffffffffffff00,
                             (unit_data *)in_stack_fffffffffffffef8);
          if (bVar1) {
            dVar4 = precise_unit::multiplier(local_18);
            dVar4 = local_10 * dVar4;
            dVar5 = precise_unit::multiplier(local_20);
            local_8 = 1.0 / (dVar4 * dVar5);
          }
          else {
            bVar1 = precise_unit::has_e_flag((precise_unit *)0x2c08e2);
            if ((bVar1) || (bVar1 = precise_unit::has_e_flag((precise_unit *)0x2c08f3), bVar1)) {
              in_stack_ffffffffffffff58 =
                   (precise_unit *)
                   detail::extraValidConversions<units::precise_unit,units::precise_unit>
                             ((double)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff48);
              uVar3 = std::isnan((double)in_stack_ffffffffffffff58);
              if ((uVar3 & 1) == 0) {
                return (double)in_stack_ffffffffffffff58;
              }
            }
            local_8 = detail::otherUsefulConversions<units::precise_unit,units::precise_unit>
                                ((double)in_stack_ffffffffffffff68,
                                 (precise_unit *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff58);
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

double convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if ((start.has_e_flag() || result.has_e_flag()) &&
        start.has_same_base(result.base_units())) {
        double converted_val = detail::convertFlaggedUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    if (start.is_equation() || result.is_equation()) {
        if (!start.base_units().equivalent_non_counting(result.base_units())) {
            return constants::invalid_conversion;
        }
        double keyval = precise::equations::convert_equnit_to_value(
            val, start.base_units());
        keyval = keyval * start.multiplier() / result.multiplier();
        return precise::equations::convert_value_to_equnit(
            keyval, result.base_units());
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }
    // check if both are pu since this doesn't require knowing a base unit
    if (start.is_per_unit() &&
        result.is_per_unit()) {  // we know they have different unit basis
        if (unit_cast(start) == pu || unit_cast(result) == pu) {
            // generic pu just means the units are equivalent since the other is
            // puXX already
            return val;
        }
        double converted_val = puconversion::knownConversions(
            val, start.base_units(), result.base_units());
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    } else if (start.is_per_unit() || result.is_per_unit()) {
        double genBase =
            puconversion::assumedBase(unit_cast(start), unit_cast(result));
        if (!std::isnan(genBase)) {
            return convert(val, start, result, genBase);
        }
        // other assumptions for PU base are probably dangerous so shouldn't be
        // allowed
        return constants::invalid_conversion;
    }

    auto base_start = start.base_units();
    auto base_result = result.base_units();
    if (base_start.has_same_base(base_result)) {
        // ignore i flag and e flag, special cases have been dealt with already,
        // so those are just markers
        return val * start.multiplier() / result.multiplier();
    }
    // deal with some counting conversions
    if (base_start.equivalent_non_counting(base_result)) {
        double converted_val = detail::convertCountingUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // check for inverse units
    if (base_start.has_same_base(base_result.inv())) {
        // ignore flag and e flag  special cases have been dealt with already,
        // so those are just markers
        return 1.0 / (val * start.multiplier() * result.multiplier());
    }
    if (start.has_e_flag() || result.has_e_flag()) {
        double converted_val =
            detail::extraValidConversions(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // this is the last chance and will return invalid_result if it doesn't find
    // a match
    return detail::otherUsefulConversions(val, start, result);
}